

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

char * zmq_msg_gets(zmq_msg_t *msg_,char *property_)

{
  metadata_t *pmVar1;
  int *piVar2;
  msg_t *in_RDI;
  char *value;
  metadata_t *metadata;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd0;
  metadata_t *local_8;
  
  pmVar1 = zmq::msg_t::metadata(in_RDI);
  local_8 = (metadata_t *)0x0;
  if (pmVar1 != (metadata_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_8 = (metadata_t *)zmq::metadata_t::get(local_8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  if (local_8 == (metadata_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_8 = (metadata_t *)0x0;
  }
  return (char *)local_8;
}

Assistant:

const char *zmq_msg_gets (const zmq_msg_t *msg_, const char *property_)
{
    const zmq::metadata_t *metadata =
      reinterpret_cast<const zmq::msg_t *> (msg_)->metadata ();
    const char *value = NULL;
    if (metadata)
        value = metadata->get (std::string (property_));
    if (value)
        return value;

    errno = EINVAL;
    return NULL;
}